

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_transaction_VerifySignature_Test::TestBody(cfdcapi_transaction_VerifySignature_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  undefined1 in_stack_0000050f;
  char *in_stack_00000510;
  int in_stack_0000051c;
  char *in_stack_00000520;
  char *in_stack_00000528;
  int in_stack_00000534;
  void *in_stack_00000538;
  char *in_stack_00000550;
  char *in_stack_00000558;
  uint32_t in_stack_00000560;
  int in_stack_00000568;
  int64_t in_stack_00000578;
  char *in_stack_00000580;
  bool *in_stack_fffffffffffffdc8;
  AssertionResult *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffdec;
  AssertHelper local_160;
  Message local_158;
  undefined4 local_14c;
  AssertionResult local_148;
  AssertHelper local_138;
  Message local_130;
  undefined4 local_124;
  AssertionResult local_120;
  AssertHelper local_110;
  Message local_108;
  undefined4 local_fc;
  AssertionResult local_f8;
  AssertHelper local_e8;
  Message local_e0;
  undefined4 local_d4;
  AssertionResult local_d0;
  AssertHelper local_c0;
  Message local_b8;
  undefined4 local_ac;
  AssertionResult local_a8;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8))
  ;
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
             (char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
             (int *)in_stack_fffffffffffffdd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3c55ca);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x2ff,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x3c562d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c5682);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,(type *)0x3c56b6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x300,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3c57b2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c582d);
  pcVar2 = "86dc9d4a8764c8658f24ab0286f215abe443f98221c272e1999c56e902c9a6ac";
  uVar5 = 0;
  uVar4 = 1;
  uVar3 = 0;
  local_14 = CfdVerifySignature(in_stack_00000538,in_stack_00000534,in_stack_00000528,
                                in_stack_00000520,in_stack_0000051c,in_stack_00000510,
                                in_stack_00000550,in_stack_00000558,in_stack_00000560,
                                in_stack_00000568,(bool)in_stack_0000050f,in_stack_00000578,
                                in_stack_00000580);
  local_ac = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffdec,uVar5),
             (char *)CONCAT44(in_stack_fffffffffffffde4,uVar4),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffddc,uVar3),(int *)pcVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3c5946);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x30c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message((Message *)0x3c59a9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c5a01);
  pcVar2 = "587bc524964147ced22d5bac41de55504e7eeb9a795b34aa0a5318612acb539c";
  uVar5 = 0;
  uVar4 = 1;
  uVar3 = 0;
  local_14 = CfdVerifySignature(in_stack_00000538,in_stack_00000534,in_stack_00000528,
                                in_stack_00000520,in_stack_0000051c,in_stack_00000510,
                                in_stack_00000550,in_stack_00000558,in_stack_00000560,
                                in_stack_00000568,(bool)in_stack_0000050f,in_stack_00000578,
                                in_stack_00000580);
  local_d4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffdec,uVar5),
             (char *)CONCAT44(in_stack_fffffffffffffde4,uVar4),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffddc,uVar3),(int *)pcVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3c5b19);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x318,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message((Message *)0x3c5b7c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c5bd4);
  pcVar2 = "86dc9d4a8764c8658f24ab0286f215abe443f98221c272e1999c56e902c9a6ac";
  uVar5 = 0;
  uVar4 = 1;
  uVar3 = 0;
  local_14 = CfdVerifySignature(in_stack_00000538,in_stack_00000534,in_stack_00000528,
                                in_stack_00000520,in_stack_0000051c,in_stack_00000510,
                                in_stack_00000550,in_stack_00000558,in_stack_00000560,
                                in_stack_00000568,(bool)in_stack_0000050f,in_stack_00000578,
                                in_stack_00000580);
  local_fc = 7;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffdec,uVar5),
             (char *)CONCAT44(in_stack_fffffffffffffde4,uVar4),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffddc,uVar3),(int *)pcVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3c5ce1);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x324,pcVar2);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message((Message *)0x3c5d3e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c5d96);
  pcVar2 = "f825690aee1b3dc247da796cacb12687a5e802429fd291cfd63e010f02cf1508";
  uVar5 = 0;
  uVar4 = 3;
  uVar3 = 0;
  local_14 = CfdVerifySignature(in_stack_00000538,in_stack_00000534,in_stack_00000528,
                                in_stack_00000520,in_stack_0000051c,in_stack_00000510,
                                in_stack_00000550,in_stack_00000558,in_stack_00000560,
                                in_stack_00000568,(bool)in_stack_0000050f,in_stack_00000578,
                                in_stack_00000580);
  local_124 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffdec,uVar5),
             (char *)CONCAT44(in_stack_fffffffffffffde4,uVar4),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffddc,uVar3),(int *)pcVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x3c5eab);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x330,message);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message((Message *)0x3c5f08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c5f5d);
  local_14 = CfdFreeHandle((void *)CONCAT44(in_stack_fffffffffffffddc,uVar3));
  local_14c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffdec,uVar5),
             (char *)CONCAT44(in_stack_fffffffffffffde4,uVar4),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffddc,uVar3),(int *)pcVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3c6012);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x333,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message((Message *)0x3c606f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c60c4);
  return;
}

Assistant:

TEST(cfdcapi_transaction, VerifySignature) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  // p2wpkh
  ret = CfdVerifySignature(
      handle, kCfdNetworkMainnet,
      "0100000001aca6c902e9569c99e172c22182f943e4ab15f28602ab248f65c864874a9ddc860000000000ffffffff01005ed0b20000000017a914eca3232c3a28a4d0c03b374d0f6053e9e546e9978700000000",
      "772fe60c82f16e05ce9e5411bb3666f7366f327233af611ed6a4067f23248a865d111f26e2b5306df6dade2524589ce868c0c0468359ed385c9ff3d79c600549",
      kCfdP2wpkh,
      "02f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef",
      nullptr,
      "86dc9d4a8764c8658f24ab0286f215abe443f98221c272e1999c56e902c9a6ac", 0,
      kCfdSigHashAll, false, int64_t{3000002000}, nullptr);
  EXPECT_EQ(kCfdSuccess, ret);

  // p2pkh
  ret = CfdVerifySignature(
      handle, kCfdNetworkMainnet,
      "01000000019c53cb2a6118530aaa345b799aeb7e4e5055de41ac5b2dd2ce47419624c57b580000000000ffffffff0130ea052a010000001976a9143cadb10040e9e7002bbd9d0620f5f79c05603ffd88ac00000000",
      "3c1cffcc8908ab1911303f102c41e5c677488346851288360b0d309ab99557207ac2c9c6aec9d8bae187a1eea843dda423edff216c568efad231e4249c77ffe1",
      kCfdP2pkh,
      "02f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef",
      nullptr,
      "587bc524964147ced22d5bac41de55504e7eeb9a795b34aa0a5318612acb539c", 0,
      kCfdSigHashAll, false, int64_t{1000}, nullptr);
  EXPECT_EQ(kCfdSuccess, ret);

  // p2wpkh: fail
  ret = CfdVerifySignature(
      handle, kCfdNetworkMainnet,
      "0100000001aca6c902e9569c99e172c22182f943e4ab15f28602ab248f65c864874a9ddc860000000000ffffffff01005ed0b20000000017a914eca3232c3a28a4d0c03b374d0f6053e9e546e9978700000000",
      "772fe60c82f16e05ce9e5411bb8666f7366f327233af611ed6a4067f23248a865d111f26e2b5306df6dade2524589ce868c0c0468359ed385c9ff3d79c600549",
      kCfdP2wpkh,
      "02f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef",
      nullptr,
      "86dc9d4a8764c8658f24ab0286f215abe443f98221c272e1999c56e902c9a6ac", 0,
      kCfdSigHashAll, false, int64_t{3000002000}, nullptr);
  EXPECT_EQ(kCfdSignVerificationError, ret);

  // p2wsh
  ret = CfdVerifySignature(
      handle, kCfdNetworkMainnet,
      "0100000002fe3dc9208094f3ffd12645477b3dc56f60ec4fa8e6f5d67c565d1c6b9216b36e0000000000ffffffff0815cf020f013ed6cf91d29f4202e8a58726b1ac6c79da47c23d1bee0a6925f80000000000ffffffff0100f2052a010000001976a914a30741f8145e5acadf23f751864167f32e0963f788ac00000000",
      "27dc95ad6b740fe5129e7e62a75dd00f291a2aeb1200b84b09d9e3789406b6c01a9ecd315dd6a0e632ab20bbb98948bc0c6fb204f2c286963bb48517a7058e27",
      kCfdP2wsh,
      "026dccc749adc2a9d0d89497ac511f760f45c47dc5ed9cf352a58ac706453880ae",
      "21026dccc749adc2a9d0d89497ac511f760f45c47dc5ed9cf352a58ac706453880aeadab210255a9626aebf5e29c0e6538428ba0d1dcf6ca98ffdf086aa8ced5e0d0215ea465ac",
      "f825690aee1b3dc247da796cacb12687a5e802429fd291cfd63e010f02cf1508", 0,
      kCfdSigHashSingle, false, int64_t{4900000000}, nullptr);
  EXPECT_EQ(kCfdSuccess, ret);

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}